

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

void __thiscall slang::ast::PortConnection::checkSimulatedNetTypes(PortConnection *this)

{
  uint uVar1;
  pointer ppPVar2;
  size_type sVar3;
  NetType *pNVar4;
  NetType *pNVar5;
  bool bVar6;
  PortSymbol *this_00;
  reference pNVar7;
  Symbol *pSVar8;
  Diagnostic *pDVar9;
  MultiPortSymbol *pMVar10;
  Type *this_01;
  Diagnostic *this_02;
  int line;
  pointer pNVar11;
  uint uVar12;
  long lVar13;
  pointer pNVar14;
  uint uVar15;
  uint uVar16;
  NetType *udnt_00;
  Scope *scope;
  NetType *udnt;
  anon_class_16_2_f87c7f41 requireMatching;
  SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> internal;
  anon_class_8_1_89926193 checker;
  SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> external;
  Scope *local_130;
  NetType *local_128;
  bitwidth_t local_120;
  uint local_11c;
  char *local_118;
  PortConnection *local_110;
  pointer local_108;
  NetType *local_100;
  anon_class_16_2_f87c7f41 local_f8;
  SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> local_e8;
  NetType **local_90;
  SmallVector<slang::ast::PortSymbol::NetTypeRange,_4UL> local_88;
  
  getExpression(this);
  if (this->expr == (Expression *)0x0) {
    return;
  }
  bVar6 = Expression::bad(this->expr);
  if (bVar6) {
    return;
  }
  local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.data_ =
       (pointer)local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.firstElement;
  local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.len = 0;
  local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.cap = 4;
  pSVar8 = this->port;
  if (pSVar8->kind == Port) {
    this_00 = Symbol::as<slang::ast::PortSymbol>(pSVar8);
    PortSymbol::getNetTypes
              (this_00,&local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>);
  }
  else {
    pMVar10 = Symbol::as<slang::ast::MultiPortSymbol>(pSVar8);
    ppPVar2 = (pMVar10->ports).data_;
    sVar3 = (pMVar10->ports).size_;
    for (lVar13 = 0; sVar3 << 3 != lVar13; lVar13 = lVar13 + 8) {
      PortSymbol::getNetTypes
                (*(PortSymbol **)((long)ppPVar2 + lVar13),
                 &local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>);
    }
  }
  local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.data_ =
       (pointer)local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.firstElement;
  local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.len = 0;
  local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.cap = 4;
  getNetRanges(this->expr,&local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>);
  if (local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.len != 0 ||
      local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.len != 0) {
    local_130 = (this->parentInstance->super_InstanceSymbolBase).super_Symbol.parentScope;
    if (local_130 == (Scope *)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/PortSymbols.cpp"
                 ,0x739,"void slang::ast::PortConnection::checkSimulatedNetTypes() const");
    }
    if (((local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.len == 1) &&
        (pNVar7 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::operator[]
                            (&local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>,0
                            ), pNVar7->netType->netKind == Interconnect)) &&
       (pSVar8 = findAnyVars(this->expr), pSVar8 != (Symbol *)0x0)) {
      pDVar9 = Scope::addDiag(local_130,(DiagCode)0x3c0006,this->expr->sourceRange);
      Diagnostic::operator<<(pDVar9,pSVar8->name);
    }
    else {
      pNVar11 = local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.data_;
      pNVar14 = local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.data_;
      local_f8.scope = &local_130;
      local_f8.this = this;
      if ((local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.len == 0) ||
         (local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.len == 0)) {
        local_90 = &local_128;
        local_128 = (NetType *)0x0;
        const::$_0::operator()((__0 *)&local_90,&local_e8);
        const::$_0::operator()((__0 *)&local_90,&local_88);
        if (local_128 != (NetType *)0x0) {
          checkSimulatedNetTypes::anon_class_16_2_f87c7f41::operator()(&local_f8,local_128);
        }
      }
      else {
        if (local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.len != 1 ||
            local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.len != 1) {
          this_01 = not_null<const_slang::ast::Type_*>::get(&this->expr->type);
          local_120 = Type::getBitWidth(this_01);
          uVar12 = 0;
          local_118 = "exprWidth >= currBit + width";
          uVar16 = 0;
          local_110 = this;
          do {
            pNVar4 = pNVar14->netType;
            pNVar5 = pNVar11->netType;
            local_100 = pNVar4;
            if ((pNVar4->netKind == UserDefined) || (pNVar5->netKind == UserDefined)) {
              if (pNVar4 != pNVar5) {
                pDVar9 = Scope::addDiag(local_130,(DiagCode)0x9a0006,local_110->expr->sourceRange);
                pDVar9 = Diagnostic::operator<<(pDVar9,(pNVar4->super_Symbol).name);
                Diagnostic::operator<<(pDVar9,(pNVar5->super_Symbol).name);
                goto LAB_001b9262;
              }
              local_128 = (NetType *)((ulong)local_128 & 0xffffffffffffff00);
            }
            else {
              NetType::getSimulatedNetType(pNVar4,pNVar5,(bool *)&local_128);
            }
            uVar1 = pNVar14->width;
            uVar15 = pNVar11->width;
            if (uVar1 < uVar15) {
              pNVar11->width = uVar15 - uVar1;
LAB_001b9076:
              pNVar14 = pNVar14 + 1;
              uVar15 = uVar1;
            }
            else {
              pNVar11 = pNVar11 + 1;
              if (uVar1 - uVar15 == 0) goto LAB_001b9076;
              pNVar14->width = uVar1 - uVar15;
            }
            local_11c = uVar12;
            local_108 = pNVar14;
            if ((char)local_128 == '\x01') {
              uVar12 = local_120 - (uVar15 + uVar16);
              if (local_120 < uVar15 + uVar16) {
                line = 0x7ce;
                goto LAB_001b9290;
              }
              pDVar9 = Scope::addDiag(local_130,(DiagCode)0xb00006,local_110->expr->sourceRange);
              Diagnostic::operator<<(pDVar9,(pNVar5->super_Symbol).name);
              this_02 = Diagnostic::operator<<(pDVar9,~uVar16 + local_120);
              Diagnostic::operator<<(this_02,uVar12);
              Diagnostic::operator<<(pDVar9,(local_100->super_Symbol).name);
              uVar12 = (uint)CONCAT71((uint7)(uint3)(uVar12 >> 8),1);
              if ((local_11c & 1) == 0) {
                Diagnostic::addNote(pDVar9,(DiagCode)0x40001,local_110->port->location);
              }
            }
            if (local_108 ==
                local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.data_ +
                local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.len) {
              if (pNVar11 ==
                  local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.data_ +
                  local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.len)
              goto LAB_001b9262;
LAB_001b9186:
              line = 0x7de;
              local_118 = "in == internal.end() && ex == external.end()";
LAB_001b9290:
              assert::assertFailed
                        (local_118,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/PortSymbols.cpp"
                         ,line,"void slang::ast::PortConnection::checkSimulatedNetTypes() const");
            }
            if (pNVar11 ==
                local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.data_ +
                local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>.len)
            goto LAB_001b9186;
            uVar16 = uVar15 + uVar16;
            pNVar14 = local_108;
          } while( true );
        }
        pNVar7 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::operator[]
                           (&local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>,0)
        ;
        pNVar4 = pNVar7->netType;
        pNVar7 = SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::operator[]
                           (&local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>,0)
        ;
        pNVar5 = pNVar7->netType;
        if (pNVar4 != pNVar5) {
          if (pNVar4->netKind == UserDefined) {
            udnt_00 = pNVar4;
            if (pNVar5->netKind == UserDefined) {
              pDVar9 = Scope::addDiag(local_130,(DiagCode)0x9b0006,this->expr->sourceRange);
              pDVar9 = Diagnostic::operator<<(pDVar9,(pNVar4->super_Symbol).name);
              Diagnostic::operator<<(pDVar9,(pNVar5->super_Symbol).name);
              goto LAB_001b9262;
            }
          }
          else {
            udnt_00 = pNVar5;
            if (pNVar5->netKind != UserDefined) {
              NetType::getSimulatedNetType(pNVar4,pNVar5,(bool *)&local_128);
              if ((char)local_128 == '\x01') {
                pDVar9 = Scope::addDiag(local_130,(DiagCode)0xaf0006,this->expr->sourceRange);
                Diagnostic::operator<<(pDVar9,(pNVar5->super_Symbol).name);
                Diagnostic::operator<<(pDVar9,(pNVar4->super_Symbol).name);
                Diagnostic::addNote(pDVar9,(DiagCode)0x40001,this->port->location);
              }
              goto LAB_001b9262;
            }
          }
          checkSimulatedNetTypes::anon_class_16_2_f87c7f41::operator()(&local_f8,udnt_00);
        }
      }
    }
  }
LAB_001b9262:
  SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::~SmallVectorBase
            (&local_88.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>);
  SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::~SmallVectorBase
            (&local_e8.super_SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>);
  return;
}

Assistant:

void PortConnection::checkSimulatedNetTypes() const {
    getExpression();
    if (!expr || expr->bad())
        return;

    SmallVector<PortSymbol::NetTypeRange, 4> internal;
    if (port.kind == SymbolKind::Port)
        port.as<PortSymbol>().getNetTypes(internal);
    else {
        for (auto p : port.as<MultiPortSymbol>().ports)
            p->getNetTypes(internal);
    }

    SmallVector<PortSymbol::NetTypeRange, 4> external;
    getNetRanges(*expr, external);

    // There might not be any nets, in which case we should just leave.
    if (internal.empty() && external.empty())
        return;

    auto scope = parentInstance.getParentScope();
    ASSERT(scope);

    // Do additional checking on the expression for interconnect port connections.
    if (internal.size() == 1 && internal[0].netType->netKind == NetType::Interconnect) {
        if (auto sym = findAnyVars(*expr)) {
            scope->addDiag(diag::InterconnectPortVar, expr->sourceRange) << sym->name;
            return;
        }
    }

    auto requireMatching = [&](const NetType& udnt) {
        // Types are more restricted; they must match instead of just being
        // assignment compatible. Also direction must be input or output.
        // We need to do this dance to get at the type of the connection prior
        // to it being converted to match the type of the port.
        auto exprType = expr->type.get();
        if (expr->kind == ExpressionKind::Conversion) {
            auto& conv = expr->as<ConversionExpression>();
            if (conv.isImplicit())
                exprType = conv.operand().type;
        }
        else if (expr->kind == ExpressionKind::Assignment) {
            auto& assign = expr->as<AssignmentExpression>();
            if (assign.isLValueArg())
                exprType = assign.left().type;
        }

        auto [direction, type] = getDirAndType(port);
        if (!type->isMatching(*exprType)) {
            // If this is from an interconnect connection, don't require matching types.
            auto isInterconnect = [](const Type& t) {
                auto curr = &t;
                while (curr->isArray())
                    curr = curr->getArrayElementType();

                return curr->isUntypedType();
            };

            if (isInterconnect(*type) || isInterconnect(*exprType))
                return;

            auto& diag = scope->addDiag(diag::MismatchedUserDefPortConn, expr->sourceRange);
            diag << udnt.name;
            diag << *type;
            diag << *exprType;
        }
        else if (direction != ArgumentDirection::In && direction != ArgumentDirection::Out) {
            auto& diag = scope->addDiag(diag::MismatchedUserDefPortDir, expr->sourceRange);
            diag << udnt.name;
        }
    };

    // If only one side has net types, check for user-defined nettypes,
    // which impose additional restrictions on the connection.
    if (internal.empty() || external.empty()) {
        const NetType* udnt = nullptr;
        auto checker = [&](auto& list) {
            for (auto& ntr : list) {
                if (!ntr.netType->isBuiltIn()) {
                    udnt = ntr.netType;
                    break;
                }
            }
        };

        checker(internal);
        checker(external);
        if (udnt)
            requireMatching(*udnt);

        return;
    }

    // Simple case is one net connected on each side.
    if (internal.size() == 1 && external.size() == 1) {
        auto& inNt = *internal[0].netType;
        auto& exNt = *external[0].netType;
        if (&inNt == &exNt)
            return;

        if (!inNt.isBuiltIn() || !exNt.isBuiltIn()) {
            // If both sides are user-defined nettypes they need to match.
            if (!inNt.isBuiltIn() && !exNt.isBuiltIn()) {
                auto& diag = scope->addDiag(diag::UserDefPortTwoSided, expr->sourceRange);
                diag << inNt.name << exNt.name;
            }
            else if (!inNt.isBuiltIn()) {
                requireMatching(inNt);
            }
            else {
                requireMatching(exNt);
            }
        }
        else {
            // Otherwise both sides are built-in nettypes.
            bool shouldWarn;
            NetType::getSimulatedNetType(inNt, exNt, shouldWarn);
            if (shouldWarn) {
                auto& diag = scope->addDiag(diag::NetInconsistent, expr->sourceRange);
                diag << exNt.name;
                diag << inNt.name;
                diag.addNote(diag::NoteDeclarationHere, port.location);
            }
        }

        return;
    }

    // Otherwise we need to compare ranges of net types for differences.
    auto in = internal.begin();
    auto ex = external.begin();
    bitwidth_t currBit = 0;
    bitwidth_t exprWidth = expr->type->getBitWidth();
    bool shownDeclaredHere = false;

    while (true) {
        bool shouldWarn;
        auto& inNt = *in->netType;
        auto& exNt = *ex->netType;

        if (!inNt.isBuiltIn() || !exNt.isBuiltIn()) {
            if (&inNt != &exNt) {
                scope->addDiag(diag::UserDefPortMixedConcat, expr->sourceRange)
                    << inNt.name << exNt.name;
                return;
            }
            shouldWarn = false;
        }
        else {
            NetType::getSimulatedNetType(inNt, exNt, shouldWarn);
        }

        bitwidth_t width;
        if (in->width < ex->width) {
            width = in->width;
            ex->width -= width;
            in++;
        }
        else {
            width = ex->width;
            ex++;

            if (in->width == width)
                in++;
            else
                in->width -= width;
        }

        if (shouldWarn) {
            ASSERT(exprWidth >= currBit + width);
            bitwidth_t left = exprWidth - currBit - 1;
            bitwidth_t right = left - (width - 1);

            auto& diag = scope->addDiag(diag::NetRangeInconsistent, expr->sourceRange);
            diag << exNt.name;
            diag << left << right;
            diag << inNt.name;

            if (!shownDeclaredHere) {
                diag.addNote(diag::NoteDeclarationHere, port.location);
                shownDeclaredHere = true;
            }
        }

        if (in == internal.end() || ex == external.end()) {
            ASSERT(in == internal.end() && ex == external.end());
            break;
        }

        currBit += width;
    }
}